

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListReader * __thiscall
capnp::_::PointerReader::getList
          (ListReader *__return_storage_ptr__,PointerReader *this,ElementSize expectedElementSize,
          word *defaultValue)

{
  unsigned_short uVar1;
  ushort uVar2;
  word *pwVar3;
  Arena *pAVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar8;
  ElementSize EVar9;
  ulong uVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  WirePointer *pWVar12;
  uint uVar13;
  int *piVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  WirePointer *pWVar19;
  char cVar20;
  WirePointer *pWVar21;
  WirePointer *pWVar22;
  DebugComparison<int_&,_int> *this_00;
  bool bVar23;
  DebugComparison<int_&,_int> _kjCondition;
  Fault f;
  Exception *local_68;
  int local_5c;
  uint local_58;
  Fault f_3;
  WirePointerCount expectedPointersPerElement;
  uint pointerCount;
  CapTableReader *local_40;
  BitCount expectedDataBitsPerElement;
  
  local_58 = (uint)CONCAT71(in_register_00000011,expectedElementSize);
  pWVar21 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar21 = this->pointer;
  }
  local_68 = (Exception *)this->segment;
  local_5c = this->nestingLimit;
  pWVar12 = pWVar21 + 1;
  iVar6 = (int)*(uint64_t *)&(pWVar21->offsetAndKind).value;
  lVar15 = (long)(iVar6 >> 2);
  if (local_68 == (Exception *)0x0) {
    pWVar19 = pWVar12 + lVar15;
  }
  else {
    pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)->ptr;
    pWVar19 = (WirePointer *)(pwVar3 + (long)local_68->file);
    if (((long)pwVar3 - (long)pWVar12 >> 3 <= lVar15) &&
       (lVar15 <= (long)pWVar19 - (long)pWVar12 >> 3)) {
      pWVar19 = pWVar12 + lVar15;
    }
  }
  local_40 = this->capTable;
  pWVar12 = (WirePointer *)defaultValue;
  if (iVar6 != 0 || (pWVar21->field_1).upper32Bits != 0) goto LAB_00359054;
  do {
    while( true ) {
      if ((pWVar12 == (WirePointer *)0x0) ||
         (iVar6 = (int)*(uint64_t *)&(pWVar12->offsetAndKind).value,
         (pWVar12->field_1).upper32Bits == 0 && iVar6 == 0)) {
        __return_storage_ptr__->ptr = (byte *)0x0;
        __return_storage_ptr__->elementCount = 0;
        __return_storage_ptr__->step = 0;
        __return_storage_ptr__->segment = (SegmentReader *)0x0;
        __return_storage_ptr__->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
        __return_storage_ptr__->elementSize = (ElementSize)local_58;
        __return_storage_ptr__->nestingLimit = 0x7fffffff;
        return __return_storage_ptr__;
      }
      local_68 = (Exception *)0x0;
      pWVar19 = pWVar12 + (long)(iVar6 >> 2) + 1;
      defaultValue = (word *)0x0;
      pWVar21 = pWVar12;
LAB_00359054:
      _kjCondition.left = &local_5c;
      _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < local_5c;
      pWVar12 = (WirePointer *)defaultValue;
      if (0 < local_5c) break;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e6,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    pWVar22 = pWVar21;
    if ((local_68 == (Exception *)0x0) || ((*(uint64_t *)&(pWVar21->offsetAndKind).value & 3) != 2))
    goto LAB_0035938e;
    pAVar4 = (Arena *)(local_68->ownFile).content.ptr;
    iVar6 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar21->field_1).upper32Bits);
    local_68 = (Exception *)CONCAT44(extraout_var,iVar6);
    _kjCondition.left = (int *)&local_68;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_68 != (Exception *)0x0;
    if (local_68 == (Exception *)0x0) {
      this_00 = (DebugComparison<int_&,_int> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      goto LAB_00359882;
    }
    uVar7 = (uint)*(uint64_t *)&(pWVar21->offsetAndKind).value;
    pcVar17 = (char *)(ulong)(uVar7 >> 3);
    pcVar16 = local_68->file;
    if ((long)pcVar16 < (long)pcVar17) {
      pcVar17 = pcVar16;
    }
    uVar10 = 2 - (ulong)((uVar7 & 4) == 0);
    if (pcVar16 < pcVar17 + uVar10) {
LAB_00359115:
      f.exception = f.exception & 0xffffffffffffff00;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&f,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
      this_00 = &_kjCondition;
LAB_00359882:
      kj::_::Debug::Fault::~Fault((Fault *)this_00);
LAB_0035988e:
      iVar6 = 2;
    }
    else {
      pWVar22 = (WirePointer *)
                (((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)->ptr +
                (long)pcVar17);
      uVar18 = (*(ReadLimiter **)&local_68->line)->limit;
      if (uVar18 < uVar10) {
        (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
        goto LAB_00359115;
      }
      (*(ReadLimiter **)&local_68->line)->limit = uVar18 - uVar10;
      if ((*(uint64_t *)&(pWVar21->offsetAndKind).value & 4) == 0) {
        pWVar21 = pWVar22 + 1;
        uVar7 = (uint)*(uint64_t *)&(pWVar22->offsetAndKind).value;
        lVar15 = (long)((int)uVar7 >> 2);
        if ((local_68 != (Exception *)0x0) &&
           ((pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)->ptr,
            pWVar19 = (WirePointer *)(pwVar3 + (long)local_68->file),
            lVar15 < (long)pwVar3 - (long)pWVar21 >> 3 ||
            ((long)pWVar19 - (long)pWVar21 >> 3 < lVar15)))) goto LAB_0035938e;
        pWVar19 = pWVar21 + lVar15;
LAB_003593a2:
        uVar7 = uVar7 & 3;
        _kjCondition.left = (int *)CONCAT44(1,uVar7);
        _kjCondition._8_8_ = anon_var_dwarf_3c21f;
        _kjCondition.op.content.ptr = &DAT_00000005;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar7 == 1);
        if (uVar7 != 1) {
          this_00 = (DebugComparison<int_&,_int> *)&f;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                    ((Fault *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                     "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      &_kjCondition,
                     (char (*) [84])
                     "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                    );
          goto LAB_00359882;
        }
        uVar7 = (pWVar22->field_1).upper32Bits;
        EVar9 = (ElementSize)uVar7 & INLINE_COMPOSITE;
        if (EVar9 == INLINE_COMPOSITE) {
          f_3.exception._0_4_ = uVar7 >> 3;
          if (local_68 != (Exception *)0x0) {
            if ((char *)(((long)pWVar19 -
                          (long)((ArrayPtr<const_capnp::word> *)
                                &(local_68->ownFile).content.disposer)->ptr >> 3) +
                         (ulong)(uint)f_3.exception + 1) <= local_68->file) {
              uVar10 = (ulong)(uint)f_3.exception + 1;
              uVar18 = (*(ReadLimiter **)&local_68->line)->limit;
              if (uVar10 <= uVar18) {
                (*(ReadLimiter **)&local_68->line)->limit = uVar18 - uVar10;
                goto LAB_0035953b;
              }
              (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
            }
            pcVar16 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
            iVar6 = 0x900;
            goto LAB_00359512;
          }
LAB_0035953b:
          uVar7 = (uint)*(uint64_t *)&(pWVar19->offsetAndKind).value & 3;
          _kjCondition.left = (int *)(ulong)uVar7;
          _kjCondition._8_8_ = anon_var_dwarf_3c21f;
          _kjCondition.op.content.ptr = &DAT_00000005;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar7 == 0);
          if (uVar7 == 0) {
            uVar7 = (uint)*(uint64_t *)&(pWVar19->offsetAndKind).value >> 2 & 0x1fffffff;
            uVar10 = (ulong)uVar7;
            uVar11 = (uint)(pWVar19->field_1).structRef.ptrCount.value +
                     (uint)(pWVar19->field_1).structRef.dataSize.value;
            piVar14 = (int *)(uVar11 * uVar10);
            _kjCondition._8_8_ = &f_3;
            _kjCondition.op.content.ptr = " <= ";
            piVar8 = (int *)(ulong)(uint)f_3.exception;
            _kjCondition.op.content.size_ = 5;
            bVar23 = (long)piVar14 - (long)piVar8 == 0;
            _kjCondition.result = piVar14 < piVar8 || bVar23;
            _kjCondition.left = piVar14;
            if (piVar14 < piVar8 || bVar23) {
              if ((uVar11 == 0) && (local_68 != (Exception *)0x0)) {
                uVar18 = (*(ReadLimiter **)&local_68->line)->limit;
                if (uVar18 < uVar10) {
                  getList();
                  goto LAB_0035988e;
                }
                (*(ReadLimiter **)&local_68->line)->limit = uVar18 - uVar10;
              }
              uVar13 = local_58 & 0xff;
              _kjCondition.left._2_6_ = (undefined6)((ulong)piVar14 >> 0x10);
              if (uVar13 - 2 < 4) {
                uVar1 = (pWVar19->field_1).structRef.dataSize.value;
                _kjCondition.left = (int *)CONCAT62(_kjCondition.left._2_6_,uVar1);
                _kjCondition.left = (int *)((ulong)_kjCondition.left & 0xffffffff);
                _kjCondition._8_8_ = anon_var_dwarf_2132c4;
                _kjCondition.op.content.ptr = &DAT_00000004;
                _kjCondition.op.content.size_ = (size_t)(uVar1 != 0);
                if (uVar1 == 0) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[84]>
                            (&f,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x935,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                             "_kjCondition,\"Schema mismatch: Expected a primitive list, but got a list of pointer-only \" \"structs.\""
                             ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                             (char (*) [84])
                             "Schema mismatch: Expected a primitive list, but got a list of pointer-only structs."
                            );
                  this_00 = (DebugComparison<int_&,_int> *)&f;
                  goto LAB_00359882;
                }
              }
              else if (uVar13 == 6) {
                uVar1 = (pWVar19->field_1).structRef.ptrCount.value;
                _kjCondition.left = (int *)CONCAT62(_kjCondition.left._2_6_,uVar1);
                _kjCondition.left = (int *)((ulong)_kjCondition.left & 0xffffffff);
                _kjCondition._8_8_ = anon_var_dwarf_2132c4;
                _kjCondition.op.content.ptr = &DAT_00000004;
                _kjCondition.op.content.size_ = (size_t)(uVar1 != 0);
                if (uVar1 == 0) {
                  this_00 = (DebugComparison<int_&,_int> *)&f;
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[79]>
                            ((Fault *)this_00,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x93d,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                             "_kjCondition,\"Schema mismatch: Expected a pointer list, but got a list of data-only \" \"structs.\""
                             ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                             (char (*) [79])
                             "Schema mismatch: Expected a pointer list, but got a list of data-only structs."
                            );
                  goto LAB_00359882;
                }
              }
              else if (uVar13 == 1) {
                pcVar16 = 
                "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                ;
                pcVar17 = 
                "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                ;
                iVar6 = 0x92a;
                goto LAB_003595f8;
              }
              uVar2 = (pWVar19->field_1).structRef.dataSize.value;
              uVar1 = (pWVar19->field_1).structRef.ptrCount.value;
              __return_storage_ptr__->segment = (SegmentReader *)local_68;
              __return_storage_ptr__->capTable = local_40;
              __return_storage_ptr__->ptr = (byte *)(pWVar19 + 1);
              __return_storage_ptr__->elementCount = uVar7;
              __return_storage_ptr__->step = uVar11 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = uVar1;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_0035994b:
              __return_storage_ptr__->nestingLimit = local_5c + -1;
              iVar6 = 1;
              goto LAB_00359893;
            }
            this_00 = (DebugComparison<int_&,_int> *)&f;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                       "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                       (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                       (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
            this_00 = (DebugComparison<int_&,_int> *)&f;
          }
          goto LAB_00359882;
        }
        f_3.exception._0_4_ = *(uint *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar7 & 7) * 4);
        pointerCount = (uint)(EVar9 == POINTER);
        uVar10 = (ulong)(uVar7 >> 3);
        uVar11 = pointerCount * 0x40 + (uint)f_3.exception;
        if (local_68 != (Exception *)0x0) {
          uVar18 = uVar11 * uVar10 + 0x3f >> 6 & 0xffffffff;
          if ((char *)(((long)pWVar19 -
                        (long)((ArrayPtr<const_capnp::word> *)&(local_68->ownFile).content.disposer)
                              ->ptr >> 3) + uVar18) <= local_68->file) {
            uVar5 = (*(ReadLimiter **)&local_68->line)->limit;
            if (uVar18 <= uVar5) {
              (*(ReadLimiter **)&local_68->line)->limit = uVar5 - uVar18;
              goto LAB_003595b7;
            }
            (*((Arena *)(local_68->ownFile).content.ptr)->_vptr_Arena[3])();
          }
          pcVar16 = "boundsCheck(segment, ptr, wordCount)";
          iVar6 = 0x958;
LAB_00359512:
          f.exception = f.exception & 0xffffffffffffff00;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar6,FAILED,pcVar16,
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          this_00 = &_kjCondition;
          goto LAB_00359882;
        }
LAB_003595b7:
        cVar20 = (char)local_58;
        if ((uVar7 & 7) != 0) {
          if ((cVar20 != '\x01') && (EVar9 == BIT)) {
            pcVar16 = 
            "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
            ;
            pcVar17 = 
            "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
            ;
            iVar6 = 0x969;
LAB_003595f8:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,iVar6,FAILED,(char *)0x0,pcVar17,(char (*) [106])(pcVar16 + 0x11));
            this_00 = &_kjCondition;
            goto LAB_00359882;
          }
LAB_00359720:
          expectedDataBitsPerElement =
               *(BitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)(local_58 & 0xff) * 4);
          _kjCondition.left = (int *)&expectedDataBitsPerElement;
          expectedPointersPerElement = (WirePointerCount)(cVar20 == '\x06');
          _kjCondition._8_8_ = &f_3;
          _kjCondition.result = expectedDataBitsPerElement <= (uint)f_3.exception;
          if ((uint)f_3.exception < expectedDataBitsPerElement) {
            pcVar16 = "expectedDataBitsPerElement <= dataSize";
            iVar6 = 0x979;
          }
          else {
            _kjCondition.result = EVar9 == POINTER || cVar20 != '\x06';
            _kjCondition.left = (int *)&expectedPointersPerElement;
            _kjCondition._8_8_ = &pointerCount;
            if (EVar9 == POINTER || cVar20 != '\x06') {
              __return_storage_ptr__->segment = (SegmentReader *)local_68;
              __return_storage_ptr__->capTable = local_40;
              __return_storage_ptr__->ptr = (byte *)pWVar19;
              __return_storage_ptr__->elementCount = uVar7 >> 3;
              __return_storage_ptr__->step = uVar11;
              __return_storage_ptr__->structDataSize = (uint)f_3.exception;
              __return_storage_ptr__->structPointerCount = (ushort)(EVar9 == POINTER);
              __return_storage_ptr__->elementSize = EVar9;
              goto LAB_0035994b;
            }
            pcVar16 = "expectedPointersPerElement <= pointerCount";
            iVar6 = 0x97d;
          }
          _kjCondition.op.content.size_ = 5;
          _kjCondition.op.content.ptr = " <= ";
          this_00 = (DebugComparison<int_&,_int> *)&f;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar6,FAILED,pcVar16,
                     "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                     ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                     (char (*) [72])
                     "Schema mismatch: Message contained list with incompatible element type.");
          goto LAB_00359882;
        }
        if (local_68 == (Exception *)0x0) goto LAB_00359720;
        uVar18 = (*(ReadLimiter **)&local_68->line)->limit;
        if (uVar10 <= uVar18) {
          (*(ReadLimiter **)&local_68->line)->limit = uVar18 - uVar10;
          goto LAB_00359720;
        }
        getList();
        goto LAB_0035988e;
      }
      pAVar4 = (Arena *)(local_68->ownFile).content.ptr;
      iVar6 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar22->field_1).upper32Bits);
      f.exception = (Exception *)CONCAT44(extraout_var_00,iVar6);
      _kjCondition.left = (int *)&f;
      _kjCondition.right = 0;
      _kjCondition._12_4_ = 0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = f.exception != (Exception *)0x0;
      if (f.exception == (Exception *)0x0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x25f,FAILED,"newSegment != nullptr",
                   "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                   (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                   (char (*) [56])"Message contains double-far pointer to unknown segment.");
      }
      else {
        uVar7 = (uint)*(uint64_t *)&(pWVar22->offsetAndKind).value & 3;
        _kjCondition.left = (int *)CONCAT44(2,uVar7);
        _kjCondition._8_8_ = anon_var_dwarf_3c21f;
        _kjCondition.op.content.ptr = &DAT_00000005;
        _kjCondition.op.content.size_ = (size_t)(uVar7 == 2);
        if (uVar7 == 2) {
          pcVar16 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar22->offsetAndKind).value >> 3);
          if ((long)(f.exception)->file < (long)pcVar16) {
            pcVar16 = (f.exception)->file;
          }
          pWVar19 = (WirePointer *)
                    (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)->
                     ptr + (long)pcVar16);
          pWVar22 = pWVar22 + 1;
          local_68 = f.exception;
          goto LAB_0035938e;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                   "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                   (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   &_kjCondition,(char (*) [51])"Second word of double-far pad must be far pointer."
                  );
      }
      pWVar19 = (WirePointer *)0x0;
      kj::_::Debug::Fault::~Fault(&f_3);
      pWVar22 = pWVar22 + 1;
LAB_0035938e:
      iVar6 = 2;
      if (pWVar19 != (WirePointer *)0x0) {
        uVar7 = (uint)*(uint64_t *)&(pWVar22->offsetAndKind).value;
        goto LAB_003593a2;
      }
    }
LAB_00359893:
    if (iVar6 != 2) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

ListReader PointerReader::getList(ElementSize expectedElementSize, const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, expectedElementSize, nestingLimit);
}